

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O3

IntResult * __thiscall
slang::parsing::NumberParser::parseInteger<slang::parsing::Preprocessor,true>
          (IntResult *__return_storage_ptr__,NumberParser *this,Preprocessor *stream)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  SourceLocation SVar4;
  Info *pIVar5;
  ulong uVar7;
  int iVar10;
  bool isNegated;
  Token baseToken;
  Token sizeToken;
  Token TVar11;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar12;
  Token TVar13;
  Token first;
  Token local_c8;
  Token local_b8;
  Token local_a8;
  Token local_98;
  Token local_88;
  Token local_78;
  Token local_60;
  Token local_50;
  Token local_40;
  undefined8 uVar6;
  undefined8 uVar8;
  Info *pIVar9;
  
  uVar7 = (ulong)(stream->lastConsumed).kind;
  Token::Token(&local_b8);
  Token::Token(&local_c8);
  TVar11 = Preprocessor::consume(stream);
  local_88._0_8_ = uVar7;
  if (TVar11.kind == IntegerBase) {
    local_c8 = TVar11;
    Token::Token(&local_50);
  }
  else {
    bVar2 = Preprocessor::peekSameLine(stream);
    if ((!bVar2) || (TVar13 = Preprocessor::peek(stream), TVar13.kind != IntegerBase)) {
      checkIntOverflow(this,TVar11);
      Token::Token(&__return_storage_ptr__->size);
      Token::Token(&__return_storage_ptr__->base);
      __return_storage_ptr__->value = TVar11;
      __return_storage_ptr__->isSimple = true;
      return __return_storage_ptr__;
    }
    local_b8 = TVar11;
    TVar11 = Preprocessor::consume(stream);
    local_50._0_8_ = local_b8._0_8_;
    local_50.info = local_b8.info;
    local_c8 = TVar11;
  }
  TVar13.info = local_50.info;
  TVar13.kind = local_50.kind;
  TVar13._2_1_ = local_50._2_1_;
  TVar13.numFlags.raw = local_50.numFlags.raw;
  TVar13.rawLen = local_50.rawLen;
  startVector(this,TVar11,TVar13);
  bVar2 = Preprocessor::peekSameLine(stream);
  if (bVar2) {
    local_98 = Preprocessor::peek(stream);
    bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_98.kind);
    if (bVar2) {
      local_a8 = local_98;
      SVar4 = Token::location(&local_98);
      this->firstLocation = SVar4;
      iVar1 = 0;
      while( true ) {
        iVar10 = iVar1;
        uVar3 = append(this,local_a8,iVar10 == 0);
        Preprocessor::consume(stream);
        TVar11 = local_a8;
        if (-1 < (int)uVar3) {
          local_40.kind = local_a8.kind;
          local_40._2_1_ = local_a8._2_1_;
          local_40.numFlags.raw = local_a8.numFlags.raw;
          local_40.rawLen = local_a8.rawLen;
          local_40.info = local_a8.info;
          local_a8 = TVar11;
          SVar4 = Token::location(&local_40);
          Preprocessor::addDiag
                    (stream,(DiagCode)0x80004,
                     (SourceLocation)((ulong)uVar3 * 0x10000000 + (long)SVar4));
          bVar2 = false;
          goto LAB_003052f8;
        }
        bVar2 = Preprocessor::peekSameLine(stream);
        if (!bVar2) break;
        local_a8 = Preprocessor::peek(stream);
        bVar2 = slang::syntax::SyntaxFacts::isPossibleVectorDigit(local_a8.kind);
        if ((!bVar2) ||
           (sVar12 = Token::trivia(&local_a8), iVar1 = iVar10 + -1,
           sVar12._M_extent._M_extent_value._M_extent_value != 0)) break;
      }
      bVar2 = iVar10 == 0;
LAB_003052f8:
      TVar13 = local_b8;
      TVar11 = local_c8;
      isNegated = local_88._0_4_ == 0x23;
      local_88.kind = local_b8.kind;
      local_88._2_1_ = local_b8._2_1_;
      local_88.numFlags.raw = local_b8.numFlags.raw;
      local_88.rawLen = local_b8.rawLen;
      local_88.info = local_b8.info;
      local_78.kind = local_c8.kind;
      local_78._2_1_ = local_c8._2_1_;
      local_78.numFlags.raw = local_c8.numFlags.raw;
      local_78.rawLen = local_c8.rawLen;
      local_78.info = local_c8.info;
      local_c8 = TVar11;
      local_b8 = TVar13;
      TVar11 = finishValue(this,local_98,bVar2,isNegated);
      (__return_storage_ptr__->size).kind = local_88.kind;
      (__return_storage_ptr__->size).field_0x2 = local_88._2_1_;
      (__return_storage_ptr__->size).numFlags = (NumericTokenFlags)local_88.numFlags.raw;
      (__return_storage_ptr__->size).rawLen = local_88.rawLen;
      (__return_storage_ptr__->size).info = local_88.info;
      (__return_storage_ptr__->base).kind = local_78.kind;
      (__return_storage_ptr__->base).field_0x2 = local_78._2_1_;
      (__return_storage_ptr__->base).numFlags = (NumericTokenFlags)local_78.numFlags.raw;
      (__return_storage_ptr__->base).rawLen = local_78.rawLen;
      (__return_storage_ptr__->base).info = local_78.info;
      __return_storage_ptr__->value = TVar11;
      __return_storage_ptr__->isSimple = false;
      return __return_storage_ptr__;
    }
    pIVar5 = local_b8.info;
    uVar6 = local_b8._0_8_;
    uVar8 = local_c8._0_8_;
    pIVar9 = local_c8.info;
    local_60._0_8_ = local_98._0_8_;
    local_60.info = local_98.info;
  }
  else {
    uVar6 = local_b8._0_8_;
    pIVar5 = local_b8.info;
    uVar8 = local_c8._0_8_;
    pIVar9 = local_c8.info;
    Token::Token(&local_60);
  }
  TVar11.info = local_60.info;
  TVar11.kind = local_60.kind;
  TVar11._2_1_ = local_60._2_1_;
  TVar11.numFlags.raw = local_60.numFlags.raw;
  TVar11.rawLen = local_60.rawLen;
  baseToken.info = pIVar9;
  baseToken.kind = (TokenKind)uVar8;
  baseToken._2_1_ = SUB81(uVar8,2);
  baseToken.numFlags.raw = SUB81(uVar8,3);
  baseToken.rawLen = SUB84(uVar8,4);
  sizeToken.info = pIVar5;
  sizeToken.kind = (TokenKind)uVar6;
  sizeToken._2_1_ = SUB81(uVar6,2);
  sizeToken.numFlags.raw = SUB81(uVar6,3);
  sizeToken.rawLen = SUB84(uVar6,4);
  reportMissingDigits(__return_storage_ptr__,this,sizeToken,baseToken,TVar11);
  return __return_storage_ptr__;
}

Assistant:

IntResult parseInteger(TStream& stream) {
        const bool isNegated = stream.getLastConsumed().kind == TokenKind::Minus;

        Token sizeToken;
        Token baseToken;

        auto token = stream.consume();
        if (token.kind == TokenKind::IntegerBase) {
            baseToken = token;
            startVector(baseToken, Token());
        }
        else {
            auto createSimple = [&] {
                checkIntOverflow(token);
                return IntResult::simple(token);
            };

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    return createSimple();
            }

            if (!stream.peek(TokenKind::IntegerBase))
                return createSimple();

            sizeToken = token;
            baseToken = stream.consume();
            startVector(baseToken, sizeToken);
        }

        if constexpr (RequireSameLine) {
            if (!stream.peekSameLine())
                return reportMissingDigits(sizeToken, baseToken, Token());
        }

        // At this point we expect to see vector digits, but they could be split out into other
        // token types because of hex literals.
        auto first = stream.peek();
        if (!syntax::SyntaxFacts::isPossibleVectorDigit(first.kind))
            return reportMissingDigits(sizeToken, baseToken, first);

        int count = 0;
        Token next = first;
        firstLocation = first.location();

        do {
            count++;
            int index = append(next, count == 1);
            stream.consume();

            if (index >= 0) {
                // This handles a really obnoxious case: 'h 3e+2
                // The second token is initially lexed as a real literal, but we need to split
                // it apart here now that we know it's a hex literal and put the remaining (new)
                // tokens back on the parser's stack.
                stream.handleExponentSplit(next, (size_t)index);

                // Bump the count so that we definitely take the modified raw text
                // instead of trying to use the initial token's raw directly.
                count++;
                break;
            }

            if constexpr (RequireSameLine) {
                if (!stream.peekSameLine())
                    break;
            }

            next = stream.peek();
        } while (syntax::SyntaxFacts::isPossibleVectorDigit(next.kind) && next.trivia().empty());

        return IntResult::vector(sizeToken, baseToken, finishValue(first, count == 1, isNegated));
    }